

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int utflen(lua_State *L)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer lVar4;
  char *pcVar5;
  char *s1;
  int lax;
  lua_Integer posj;
  lua_Integer posi;
  char *s;
  size_t len;
  lua_Integer n;
  lua_State *L_local;
  
  len = 0;
  n = (lua_Integer)L;
  pcVar3 = luaL_checklstring(L,1,(size_t *)&s);
  lVar4 = luaL_optinteger((lua_State *)n,2,1);
  posj = u_posrelat(lVar4,(size_t)s);
  lVar4 = luaL_optinteger((lua_State *)n,3,-1);
  lVar4 = u_posrelat(lVar4,(size_t)s);
  iVar2 = lua_toboolean((lua_State *)n,4);
  bVar1 = false;
  if (0 < posj) {
    posj = posj + -1;
    bVar1 = posj <= (long)s;
  }
  if (!bVar1) {
    luaL_argerror((lua_State *)n,2,"initial position out of bounds");
  }
  if ((long)s <= lVar4 + -1) {
    luaL_argerror((lua_State *)n,3,"final position out of bounds");
  }
  while( true ) {
    if (lVar4 + -1 < posj) {
      lua_pushinteger((lua_State *)n,len);
      return 1;
    }
    pcVar5 = utf8_decode(pcVar3 + posj,(utfint *)0x0,(iVar2 != 0 ^ 0xff) & 1);
    if (pcVar5 == (char *)0x0) break;
    posj = (long)pcVar5 - (long)pcVar3;
    len = len + 1;
  }
  lua_pushnil((lua_State *)n);
  lua_pushinteger((lua_State *)n,posj + 1);
  return 2;
}

Assistant:

static int utflen (lua_State *L) {
  lua_Integer n = 0;  /* counter for the number of characters */
  size_t len;  /* string length in bytes */
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer posj = u_posrelat(luaL_optinteger(L, 3, -1), len);
  int lax = lua_toboolean(L, 4);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 2,
                   "initial position out of bounds");
  luaL_argcheck(L, --posj < (lua_Integer)len, 3,
                   "final position out of bounds");
  while (posi <= posj) {
    const char *s1 = utf8_decode(s + posi, NULL, !lax);
    if (s1 == NULL) {  /* conversion error? */
      luaL_pushfail(L);  /* return fail ... */
      lua_pushinteger(L, posi + 1);  /* ... and current position */
      return 2;
    }
    posi = s1 - s;
    n++;
  }
  lua_pushinteger(L, n);
  return 1;
}